

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::FileOptions::_InternalSerialize
          (FileOptions *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  FeatureSet *value;
  bool bVar1;
  int iVar2;
  FileOptions_OptimizeMode value_00;
  uint uVar3;
  uint32_t *puVar4;
  char *pcVar5;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_00;
  const_reference this_01;
  anon_union_160_1_493b367e_for_FileOptions_10 *this_02;
  FileOptions *pFVar6;
  UnknownFieldSet *unknown_fields;
  string_view sVar7;
  UninterpretedOption *repfield;
  uint n;
  uint i;
  string_view local_1b0;
  string *local_1a0;
  string *_s_9;
  char *local_190;
  string_view local_188;
  string *local_178;
  string *_s_8;
  char *local_168;
  string_view local_160;
  string *local_150;
  string *_s_7;
  char *local_140;
  string_view local_138;
  string *local_128;
  string *_s_6;
  char *local_118;
  string_view local_110;
  string *local_100;
  string *_s_5;
  char *local_f0;
  string_view local_e8;
  string *local_d8;
  string *_s_4;
  char *local_c8;
  string_view local_c0;
  string *local_b0;
  string *_s_3;
  char *local_a0;
  string_view local_98;
  string *local_88;
  string *_s_2;
  char *local_78;
  string_view local_70;
  string *local_60;
  string *_s_1;
  char *local_50;
  string_view local_48;
  string *local_38;
  string *_s;
  FileOptions *pFStack_28;
  uint32_t cached_has_bits;
  FileOptions *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  FileOptions *this_local;
  
  _s._4_4_ = 0;
  pFStack_28 = this;
  this_ = (FileOptions *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar4 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  _s._4_4_ = *puVar4;
  if ((_s._4_4_ & 1) != 0) {
    local_38 = _internal_java_package_abi_cxx11_(pFStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar2 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"google.protobuf.FileOptions.java_package");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar5,iVar2,SERIALIZE,local_48);
    pFVar6 = this_;
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    local_50 = sVar7._M_str;
    _s_1 = (string *)sVar7._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar6,1,sVar7,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 2) != 0) {
    local_60 = _internal_java_outer_classname_abi_cxx11_(pFStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar2 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_70,"google.protobuf.FileOptions.java_outer_classname");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar5,iVar2,SERIALIZE,local_70);
    pFVar6 = this_;
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    local_78 = sVar7._M_str;
    _s_2 = (string *)sVar7._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar6,8,sVar7,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x40000) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    value_00 = _internal_optimize_for(pFStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(9,value_00,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x800) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    bVar1 = _internal_java_multiple_files(pFStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(10,bVar1,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 4) != 0) {
    local_88 = _internal_go_package_abi_cxx11_(pFStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar2 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_98,"google.protobuf.FileOptions.go_package");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar5,iVar2,SERIALIZE,local_98);
    pFVar6 = this_;
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
    local_a0 = sVar7._M_str;
    _s_3 = (string *)sVar7._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar6,0xb,sVar7,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x1000) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    bVar1 = _internal_cc_generic_services(pFStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(0x10,bVar1,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x2000) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    bVar1 = _internal_java_generic_services(pFStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(0x11,bVar1,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x4000) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    bVar1 = _internal_py_generic_services(pFStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(0x12,bVar1,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x8000) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    bVar1 = _internal_java_generate_equals_and_hash(pFStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(0x14,bVar1,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x10000) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    bVar1 = _internal_deprecated(pFStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(0x17,bVar1,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x20000) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    bVar1 = _internal_java_string_check_utf8(pFStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(0x1b,bVar1,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x80000) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    bVar1 = _internal_cc_enable_arenas(pFStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(0x1f,bVar1,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 8) != 0) {
    local_b0 = _internal_objc_class_prefix_abi_cxx11_(pFStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar2 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_c0,"google.protobuf.FileOptions.objc_class_prefix");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar5,iVar2,SERIALIZE,local_c0);
    pFVar6 = this_;
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b0);
    local_c8 = sVar7._M_str;
    _s_4 = (string *)sVar7._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar6,0x24,sVar7,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x10) != 0) {
    local_d8 = _internal_csharp_namespace_abi_cxx11_(pFStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar2 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_e8,"google.protobuf.FileOptions.csharp_namespace");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar5,iVar2,SERIALIZE,local_e8);
    pFVar6 = this_;
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_d8);
    local_f0 = sVar7._M_str;
    _s_5 = (string *)sVar7._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar6,0x25,sVar7,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x20) != 0) {
    local_100 = _internal_swift_prefix_abi_cxx11_(pFStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar2 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_110,"google.protobuf.FileOptions.swift_prefix");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar5,iVar2,SERIALIZE,local_110);
    pFVar6 = this_;
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_100);
    local_118 = sVar7._M_str;
    _s_6 = (string *)sVar7._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar6,0x27,sVar7,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x40) != 0) {
    local_128 = _internal_php_class_prefix_abi_cxx11_(pFStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar2 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_138,"google.protobuf.FileOptions.php_class_prefix");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar5,iVar2,SERIALIZE,local_138);
    pFVar6 = this_;
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_128);
    local_140 = sVar7._M_str;
    _s_7 = (string *)sVar7._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar6,0x28,sVar7,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x80) != 0) {
    local_150 = _internal_php_namespace_abi_cxx11_(pFStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar2 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_160,"google.protobuf.FileOptions.php_namespace");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar5,iVar2,SERIALIZE,local_160);
    pFVar6 = this_;
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_150);
    local_168 = sVar7._M_str;
    _s_8 = (string *)sVar7._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar6,0x29,sVar7,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x100) != 0) {
    local_178 = _internal_php_metadata_namespace_abi_cxx11_(pFStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar2 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_188,"google.protobuf.FileOptions.php_metadata_namespace");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar5,iVar2,SERIALIZE,local_188);
    pFVar6 = this_;
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_178);
    local_190 = sVar7._M_str;
    _s_9 = (string *)sVar7._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar6,0x2c,sVar7,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x200) != 0) {
    local_1a0 = _internal_ruby_package_abi_cxx11_(pFStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar2 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1b0,"google.protobuf.FileOptions.ruby_package");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar5,iVar2,SERIALIZE,local_1b0);
    pFVar6 = this_;
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1a0);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar6,0x2d,sVar7,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x400) != 0) {
    value = (pFStack_28->field_0)._impl_.features_;
    iVar2 = FeatureSet::GetCachedSize((pFStack_28->field_0)._impl_.features_);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (0x32,(MessageLite *)value,iVar2,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  repfield._4_4_ = 0;
  uVar3 = _internal_uninterpreted_option_size(pFStack_28);
  for (; repfield._4_4_ < uVar3; repfield._4_4_ = repfield._4_4_ + 1) {
    this_00 = _internal_uninterpreted_option(pFStack_28);
    this_01 = RepeatedPtrField<google::protobuf::UninterpretedOption>::Get(this_00,repfield._4_4_);
    iVar2 = UninterpretedOption::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (999,(MessageLite *)this_01,iVar2,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  this_02 = &pFStack_28->field_0;
  pFVar6 = default_instance();
  stream_local = (EpsCopyOutputStream *)
                 internal::ExtensionSet::_InternalSerializeAll
                           (&(this_02->_impl_)._extensions_,(MessageLite *)pFVar6,
                            (uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  bVar1 = internal::InternalMetadata::have_unknown_fields
                    (&(pFStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pFStack_28->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FileOptions::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FileOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileOptions)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string java_package = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_java_package();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.java_package");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // optional string java_outer_classname = 8;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_java_outer_classname();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.java_outer_classname");
    target = stream->WriteStringMaybeAliased(8, _s, target);
  }

  // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
  if ((cached_has_bits & 0x00040000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        9, this_._internal_optimize_for(), target);
  }

  // optional bool java_multiple_files = 10 [default = false];
  if ((cached_has_bits & 0x00000800u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        10, this_._internal_java_multiple_files(), target);
  }

  // optional string go_package = 11;
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_go_package();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.go_package");
    target = stream->WriteStringMaybeAliased(11, _s, target);
  }

  // optional bool cc_generic_services = 16 [default = false];
  if ((cached_has_bits & 0x00001000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        16, this_._internal_cc_generic_services(), target);
  }

  // optional bool java_generic_services = 17 [default = false];
  if ((cached_has_bits & 0x00002000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        17, this_._internal_java_generic_services(), target);
  }

  // optional bool py_generic_services = 18 [default = false];
  if ((cached_has_bits & 0x00004000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        18, this_._internal_py_generic_services(), target);
  }

  // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
  if ((cached_has_bits & 0x00008000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        20, this_._internal_java_generate_equals_and_hash(), target);
  }

  // optional bool deprecated = 23 [default = false];
  if ((cached_has_bits & 0x00010000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        23, this_._internal_deprecated(), target);
  }

  // optional bool java_string_check_utf8 = 27 [default = false];
  if ((cached_has_bits & 0x00020000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        27, this_._internal_java_string_check_utf8(), target);
  }

  // optional bool cc_enable_arenas = 31 [default = true];
  if ((cached_has_bits & 0x00080000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        31, this_._internal_cc_enable_arenas(), target);
  }

  // optional string objc_class_prefix = 36;
  if ((cached_has_bits & 0x00000008u) != 0) {
    const ::std::string& _s = this_._internal_objc_class_prefix();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.objc_class_prefix");
    target = stream->WriteStringMaybeAliased(36, _s, target);
  }

  // optional string csharp_namespace = 37;
  if ((cached_has_bits & 0x00000010u) != 0) {
    const ::std::string& _s = this_._internal_csharp_namespace();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.csharp_namespace");
    target = stream->WriteStringMaybeAliased(37, _s, target);
  }

  // optional string swift_prefix = 39;
  if ((cached_has_bits & 0x00000020u) != 0) {
    const ::std::string& _s = this_._internal_swift_prefix();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.swift_prefix");
    target = stream->WriteStringMaybeAliased(39, _s, target);
  }

  // optional string php_class_prefix = 40;
  if ((cached_has_bits & 0x00000040u) != 0) {
    const ::std::string& _s = this_._internal_php_class_prefix();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.php_class_prefix");
    target = stream->WriteStringMaybeAliased(40, _s, target);
  }

  // optional string php_namespace = 41;
  if ((cached_has_bits & 0x00000080u) != 0) {
    const ::std::string& _s = this_._internal_php_namespace();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.php_namespace");
    target = stream->WriteStringMaybeAliased(41, _s, target);
  }

  // optional string php_metadata_namespace = 44;
  if ((cached_has_bits & 0x00000100u) != 0) {
    const ::std::string& _s = this_._internal_php_metadata_namespace();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.php_metadata_namespace");
    target = stream->WriteStringMaybeAliased(44, _s, target);
  }

  // optional string ruby_package = 45;
  if ((cached_has_bits & 0x00000200u) != 0) {
    const ::std::string& _s = this_._internal_ruby_package();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.ruby_package");
    target = stream->WriteStringMaybeAliased(45, _s, target);
  }

  // optional .google.protobuf.FeatureSet features = 50;
  if ((cached_has_bits & 0x00000400u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        50, *this_._impl_.features_, this_._impl_.features_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_uninterpreted_option_size());
       i < n; i++) {
    const auto& repfield = this_._internal_uninterpreted_option().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            999, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileOptions)
  return target;
}